

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_Error TT_Load_Context(TT_ExecContext exec,TT_Face face,TT_Size size)

{
  uint uVar1;
  FT_ULong *pFVar2;
  FT_Error error;
  TT_MaxProfile *maxp;
  FT_ULong tmp;
  TT_Size pTStack_28;
  FT_Int i;
  TT_Size size_local;
  TT_Face face_local;
  TT_ExecContext exec_local;
  
  exec->face = face;
  exec->size = size;
  pTStack_28 = size;
  size_local = (TT_Size)face;
  face_local = (TT_Face)exec;
  if (size != (TT_Size)0x0) {
    exec->numFDefs = size->num_function_defs;
    exec->maxFDefs = size->max_function_defs;
    exec->numIDefs = size->num_instruction_defs;
    exec->maxIDefs = size->max_instruction_defs;
    exec->FDefs = size->function_defs;
    exec->IDefs = size->instruction_defs;
    exec->pointSize = size->point_size;
    memcpy(&exec->tt_metrics,&size->ttmetrics,0x50);
    memcpy(&face_local->horizontal,pTStack_28->metrics,0x38);
    *(FT_UInt *)&(face_local->postscript).italicAngle = pTStack_28->max_func;
    *(FT_UInt *)((long)&(face_local->postscript).italicAngle + 4) = pTStack_28->max_ins;
    for (tmp._4_4_ = 0; tmp._4_4_ < 3; tmp._4_4_ = tmp._4_4_ + 1) {
      pFVar2 = &(face_local->postscript).maxMemType42 + (long)tmp._4_4_ * 2;
      *pFVar2 = (FT_ULong)pTStack_28->codeRangeTable[tmp._4_4_].base;
      pFVar2[1] = pTStack_28->codeRangeTable[tmp._4_4_].size;
    }
    memcpy((face_local->vertical).Reserved + 2,&pTStack_28->GS,0x60);
    (face_local->os2).ulUnicodeRange3 = pTStack_28->cvt_size;
    (face_local->os2).ulUnicodeRange4 = (FT_ULong)pTStack_28->cvt;
    *(FT_UShort *)&face_local->access_glyph_frame = pTStack_28->storage_size;
    face_local->forget_glyph_frame = (TT_Loader_EndGlyphFunc)pTStack_28->storage;
    memcpy(&(face_local->header).Magic_Number,&pTStack_28->twilight,0x40);
    memset(&(face_local->root).num_charmaps,0,0x40);
    memcpy(&(face_local->root).units_per_EM,&(face_local->root).num_charmaps,0x40);
    memcpy(&(face_local->root).sizes_list,&(face_local->root).num_charmaps,0x40);
  }
  maxp = (TT_MaxProfile *)(face_local->root).family_name;
  exec_local._4_4_ =
       Update_Max((FT_Memory)(face_local->root).face_flags,(FT_ULong *)&maxp,8,
                  &(face_local->root).style_name,
                  (long)(int)((face->max_profile).maxStackElements + 0x20));
  (face_local->root).family_name = (FT_String *)maxp;
  if (exec_local._4_4_ == 0) {
    uVar1._0_2_ = (face_local->os2).usWinAscent;
    uVar1._2_2_ = (face_local->os2).usWinDescent;
    maxp = (TT_MaxProfile *)(ulong)uVar1;
    exec_local._4_4_ =
         Update_Max((FT_Memory)(face_local->root).face_flags,(FT_ULong *)&maxp,1,
                    &(face_local->os2).ulCodePageRange1,
                    (ulong)(face->max_profile).maxSizeOfInstructions);
    (face_local->os2).usWinAscent = (short)(int)maxp;
    (face_local->os2).usWinDescent = (short)((uint)(int)maxp >> 0x10);
    if (exec_local._4_4_ == 0) {
      *(undefined2 *)((long)&(face_local->ttc_header).offsets + 4) = 0;
      *(undefined2 *)((long)&(face_local->ttc_header).offsets + 6) = 0;
      memcpy(&(face_local->root).units_per_EM,&(face_local->ttc_header).count,0x40);
      memcpy(&(face_local->root).sizes_list,&(face_local->ttc_header).count,0x40);
      memcpy(&(face_local->root).num_charmaps,&(face_local->ttc_header).count,0x40);
      *(undefined1 *)&face_local->mm = 0;
      exec_local._4_4_ = 0;
    }
  }
  return exec_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Load_Context( TT_ExecContext  exec,
                   TT_Face         face,
                   TT_Size         size )
  {
    FT_Int          i;
    FT_ULong        tmp;
    TT_MaxProfile*  maxp;
    FT_Error        error;


    exec->face = face;
    maxp       = &face->max_profile;
    exec->size = size;

    if ( size )
    {
      exec->numFDefs   = size->num_function_defs;
      exec->maxFDefs   = size->max_function_defs;
      exec->numIDefs   = size->num_instruction_defs;
      exec->maxIDefs   = size->max_instruction_defs;
      exec->FDefs      = size->function_defs;
      exec->IDefs      = size->instruction_defs;
      exec->pointSize  = size->point_size;
      exec->tt_metrics = size->ttmetrics;
      exec->metrics    = *size->metrics;

      exec->maxFunc    = size->max_func;
      exec->maxIns     = size->max_ins;

      for ( i = 0; i < TT_MAX_CODE_RANGES; i++ )
        exec->codeRangeTable[i] = size->codeRangeTable[i];

      /* set graphics state */
      exec->GS = size->GS;

      exec->cvtSize = size->cvt_size;
      exec->cvt     = size->cvt;

      exec->storeSize = size->storage_size;
      exec->storage   = size->storage;

      exec->twilight  = size->twilight;

      /* In case of multi-threading it can happen that the old size object */
      /* no longer exists, thus we must clear all glyph zone references.   */
      FT_ZERO( &exec->zp0 );
      exec->zp1 = exec->zp0;
      exec->zp2 = exec->zp0;
    }

    /* XXX: We reserve a little more elements on the stack to deal safely */
    /*      with broken fonts like arialbs, courbs, timesbs, etc.         */
    tmp = (FT_ULong)exec->stackSize;
    error = Update_Max( exec->memory,
                        &tmp,
                        sizeof ( FT_F26Dot6 ),
                        (void*)&exec->stack,
                        maxp->maxStackElements + 32 );
    exec->stackSize = (FT_Long)tmp;
    if ( error )
      return error;

    tmp = (FT_ULong)exec->glyphSize;
    error = Update_Max( exec->memory,
                        &tmp,
                        sizeof ( FT_Byte ),
                        (void*)&exec->glyphIns,
                        maxp->maxSizeOfInstructions );
    exec->glyphSize = (FT_UInt)tmp;
    if ( error )
      return error;

    exec->pts.n_points   = 0;
    exec->pts.n_contours = 0;

    exec->zp1 = exec->pts;
    exec->zp2 = exec->pts;
    exec->zp0 = exec->pts;

    exec->instruction_trap = FALSE;

    return FT_Err_Ok;
  }